

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puppet.cpp
# Opt level: O1

void chai_puppet(ChaiScript *chai,NameMap *namemap,string *script_prefix)

{
  Dispatch_Engine *this;
  pointer pcVar1;
  Proxy_Function_Base *pPVar2;
  pointer *ppTVar3;
  Type_Conversions *this_00;
  initializer_list<chaiscript::Type_Info> __l;
  initializer_list<chaiscript::Type_Info> __l_00;
  initializer_list<chaiscript::Type_Info> __l_01;
  initializer_list<chaiscript::Type_Info> __l_02;
  allocator_type local_101;
  undefined1 local_100 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  pointer local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  pointer_____offset_0x10___ *local_b8;
  undefined4 local_b0;
  pointer_____offset_0x10___ *local_a8;
  pointer_____offset_0x10___ *local_a0;
  undefined4 local_98;
  undefined1 local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  long local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_78;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_68;
  Proxy_Function local_50;
  NameMap *local_40;
  string *local_38;
  
  local_100 = (undefined1  [8])&henson::BaseCoroutine::typeinfo;
  local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&henson::BaseCoroutine::typeinfo;
  local_f0 = (pointer)((ulong)local_f0 & 0xffffffff00000000);
  local_d8._0_8_ = local_d8 + 0x10;
  local_40 = namemap;
  local_38 = script_prefix;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"BaseCoroutine","");
  this = &chai->m_engine;
  chaiscript::detail::Dispatch_Engine::add(this,(Type_Info *)local_100,(string *)local_d8);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
  }
  chaiscript::fun<bool,henson::BaseCoroutine>((offset_in_BaseCoroutine_to_subr)local_100);
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"running","");
  chaiscript::detail::Dispatch_Engine::validate_object_name(this,(string *)local_d8);
  chaiscript::detail::Dispatch_Engine::add_function
            (this,(Proxy_Function *)local_100,(string *)local_d8);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
  }
  if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
  }
  chaiscript::fun<void,henson::BaseCoroutine>((offset_in_BaseCoroutine_to_subr)local_100);
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"signal_stop","");
  chaiscript::detail::Dispatch_Engine::validate_object_name(this,(string *)local_d8);
  chaiscript::detail::Dispatch_Engine::add_function
            (this,(Proxy_Function *)local_100,(string *)local_d8);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
  }
  if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
  }
  chaiscript::fun<unsigned_long_long,henson::BaseCoroutine>
            ((offset_in_BaseCoroutine_to_subr)local_100);
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"total_time","");
  chaiscript::detail::Dispatch_Engine::validate_object_name(this,(string *)local_d8);
  chaiscript::detail::Dispatch_Engine::add_function
            (this,(Proxy_Function *)local_100,(string *)local_d8);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
  }
  if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
  }
  chaiscript::fun<std::__cxx11::string_const&,henson::BaseCoroutine>
            ((offset_in_BaseCoroutine_to_subr)local_100);
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"name","");
  chaiscript::detail::Dispatch_Engine::validate_object_name(this,(string *)local_d8);
  chaiscript::detail::Dispatch_Engine::add_function
            (this,(Proxy_Function *)local_100,(string *)local_d8);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
  }
  if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
  }
  chaiscript::base_class<henson::BaseCoroutine,henson::Puppet>
            ((shared_ptr<chaiscript::detail::Type_Conversion_Base> *)local_d8);
  this_00 = &(chai->m_engine).m_conversions;
  chaiscript::Type_Conversions::add_conversion
            (this_00,(shared_ptr<chaiscript::detail::Type_Conversion_Base> *)local_d8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  local_100 = (undefined1  [8])&henson::Puppet::typeinfo;
  local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&henson::Puppet::typeinfo;
  local_f0 = (pointer)((ulong)local_f0 & 0xffffffff00000000);
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"Puppet","");
  chaiscript::detail::Dispatch_Engine::add(this,(Type_Info *)local_100,(string *)local_d8);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
  }
  pPVar2 = (Proxy_Function_Base *)operator_new(0x28);
  local_d8._0_8_ = &bool::typeinfo;
  local_d8._8_8_ = &bool::typeinfo;
  local_d8._16_4_ = 0;
  local_d8._24_8_ = &henson::Puppet::typeinfo;
  local_b8 = &henson::Puppet::typeinfo;
  local_b0 = 2;
  __l._M_len = 2;
  __l._M_array = (iterator)local_d8;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_100,__l,
             (allocator_type *)&local_68);
  chaiscript::dispatch::Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            ((Proxy_Function_Impl_Base *)pPVar2,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_100);
  if (local_100 != (undefined1  [8])0x0) {
    operator_delete((void *)local_100,(long)local_f0 - (long)local_100);
  }
  pPVar2->_vptr_Proxy_Function_Base = (_func_int **)&PTR__Proxy_Function_Base_003151b8;
  local_90 = (undefined1  [8])pPVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::dispatch::Proxy_Function_Base*>(&local_88,pPVar2);
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"proceed","");
  chaiscript::detail::Dispatch_Engine::validate_object_name(this,(string *)local_d8);
  chaiscript::detail::Dispatch_Engine::add_function
            (this,(Proxy_Function *)local_90,(string *)local_d8);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
  }
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  local_90 = (undefined1  [8])local_40;
  local_88._M_pi = &local_78;
  pcVar1 = (local_38->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + local_38->_M_string_length);
  pPVar2 = (Proxy_Function_Base *)operator_new(0x50);
  local_100 = local_90;
  local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_88._M_pi,
             (long)&(local_88._M_pi)->_vptr__Sp_counted_base + local_80);
  local_d8._0_8_ = &std::shared_ptr<henson::Puppet>::typeinfo;
  local_d8._8_8_ = &henson::Puppet::typeinfo;
  local_d8._16_4_ = 0;
  local_d8._24_8_ = &std::__cxx11::string::typeinfo;
  local_b8 = &std::__cxx11::string::typeinfo;
  local_b0 = 0;
  local_a8 = &henson::ProcMap*::typeinfo;
  local_a0 = &henson::ProcMap::typeinfo;
  local_98 = 4;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_d8;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&local_68,__l_00,&local_101);
  chaiscript::dispatch::Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            ((Proxy_Function_Impl_Base *)pPVar2,&local_68);
  if (local_68.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pPVar2->_vptr_Proxy_Function_Base = (_func_int **)&PTR__Proxy_Function_Callable_Impl_00315230;
  pPVar2[1]._vptr_Proxy_Function_Base = (_func_int **)local_100;
  ppTVar3 = &pPVar2[1].m_types.
             super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  pPVar2[1].m_types.
  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppTVar3;
  if ((pointer)local_f8._M_pi == (pointer)local_e8) {
    *ppTVar3 = (pointer)CONCAT71(local_e8._1_7_,local_e8[0]);
    pPVar2[1].m_arity = local_e8._8_4_;
    pPVar2[1].m_has_arithmetic_param = (bool)local_e8[0xc];
    *(undefined3 *)&pPVar2[1].field_0x25 = local_e8._13_3_;
  }
  else {
    pPVar2[1].m_types.
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_f8._M_pi;
    pPVar2[1].m_types.
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT71(local_e8._1_7_,local_e8[0]);
  }
  pPVar2[1].m_types.
  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
  super__Vector_impl_data._M_finish = local_f0;
  local_f0 = (pointer)0x0;
  local_e8[0] = 0;
  local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8;
  local_50.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = pPVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::dispatch::Proxy_Function_Base*>
            (&local_50.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,pPVar2);
  if ((pointer)local_f8._M_pi != (pointer)local_e8) {
    operator_delete(local_f8._M_pi,CONCAT71(local_e8._1_7_,local_e8[0]) + 1);
  }
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"load","");
  chaiscript::detail::Dispatch_Engine::validate_object_name(this,(string *)local_d8);
  chaiscript::detail::Dispatch_Engine::add_function(this,&local_50,(string *)local_d8);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
  }
  if (local_50.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_88._M_pi != &local_78) {
    operator_delete(local_88._M_pi,(long)local_78._vptr__Sp_counted_base + 1);
  }
  chaiscript::base_class<henson::BaseCoroutine,henson::PythonPuppet>
            ((shared_ptr<chaiscript::detail::Type_Conversion_Base> *)local_d8);
  chaiscript::Type_Conversions::add_conversion
            (this_00,(shared_ptr<chaiscript::detail::Type_Conversion_Base> *)local_d8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  local_100 = (undefined1  [8])&henson::PythonPuppet::typeinfo;
  local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&henson::PythonPuppet::typeinfo;
  local_f0 = (pointer)((ulong)local_f0 & 0xffffffff00000000);
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"PythonPuppet","");
  chaiscript::detail::Dispatch_Engine::add(this,(Type_Info *)local_100,(string *)local_d8);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
  }
  pPVar2 = (Proxy_Function_Base *)operator_new(0x28);
  local_d8._0_8_ = &bool::typeinfo;
  local_d8._8_8_ = &bool::typeinfo;
  local_d8._16_4_ = 0;
  local_d8._24_8_ = &henson::PythonPuppet::typeinfo;
  local_b8 = &henson::PythonPuppet::typeinfo;
  local_b0 = 2;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_d8;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_100,
             __l_01,(allocator_type *)&local_68);
  chaiscript::dispatch::Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            ((Proxy_Function_Impl_Base *)pPVar2,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_100);
  if (local_100 != (undefined1  [8])0x0) {
    operator_delete((void *)local_100,(long)local_f0 - (long)local_100);
  }
  pPVar2->_vptr_Proxy_Function_Base = (_func_int **)&PTR__Proxy_Function_Base_003152a8;
  local_90 = (undefined1  [8])pPVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::dispatch::Proxy_Function_Base*>(&local_88,pPVar2);
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"proceed","");
  chaiscript::detail::Dispatch_Engine::validate_object_name(this,(string *)local_d8);
  chaiscript::detail::Dispatch_Engine::add_function
            (this,(Proxy_Function *)local_90,(string *)local_d8);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
  }
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  local_90 = (undefined1  [8])local_40;
  local_88._M_pi = &local_78;
  pcVar1 = (local_38->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + local_38->_M_string_length);
  pPVar2 = (Proxy_Function_Base *)operator_new(0x50);
  local_100 = local_90;
  local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_88._M_pi,
             (long)&(local_88._M_pi)->_vptr__Sp_counted_base + local_80);
  local_d8._0_8_ = &std::shared_ptr<henson::PythonPuppet>::typeinfo;
  local_d8._8_8_ = &henson::PythonPuppet::typeinfo;
  local_d8._16_4_ = 0;
  local_d8._24_8_ = &std::__cxx11::string::typeinfo;
  local_b8 = &std::__cxx11::string::typeinfo;
  local_b0 = 0;
  local_a8 = &henson::ProcMap*::typeinfo;
  local_a0 = &henson::ProcMap::typeinfo;
  local_98 = 4;
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)local_d8;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&local_68,__l_02,&local_101);
  chaiscript::dispatch::Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            ((Proxy_Function_Impl_Base *)pPVar2,&local_68);
  if (local_68.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pPVar2->_vptr_Proxy_Function_Base = (_func_int **)&PTR__Proxy_Function_Callable_Impl_00315320;
  pPVar2[1]._vptr_Proxy_Function_Base = (_func_int **)local_100;
  ppTVar3 = &pPVar2[1].m_types.
             super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  pPVar2[1].m_types.
  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppTVar3;
  if ((pointer)local_f8._M_pi == (pointer)local_e8) {
    *ppTVar3 = (pointer)CONCAT71(local_e8._1_7_,local_e8[0]);
    pPVar2[1].m_arity = local_e8._8_4_;
    pPVar2[1].m_has_arithmetic_param = (bool)local_e8[0xc];
    *(undefined3 *)&pPVar2[1].field_0x25 = local_e8._13_3_;
  }
  else {
    pPVar2[1].m_types.
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_f8._M_pi;
    pPVar2[1].m_types.
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT71(local_e8._1_7_,local_e8[0]);
  }
  pPVar2[1].m_types.
  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
  super__Vector_impl_data._M_finish = local_f0;
  local_f0 = (pointer)0x0;
  local_e8[0] = 0;
  local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8;
  local_50.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = pPVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::dispatch::Proxy_Function_Base*>
            (&local_50.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,pPVar2);
  if ((pointer)local_f8._M_pi != (pointer)local_e8) {
    operator_delete(local_f8._M_pi,CONCAT71(local_e8._1_7_,local_e8[0]) + 1);
  }
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"python","");
  chaiscript::detail::Dispatch_Engine::validate_object_name(this,(string *)local_d8);
  chaiscript::detail::Dispatch_Engine::add_function(this,&local_50,(string *)local_d8);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
  }
  if (local_50.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_88._M_pi != &local_78) {
    operator_delete(local_88._M_pi,(long)local_78._vptr__Sp_counted_base + 1);
  }
  return;
}

Assistant:

void chai_puppet(chaiscript::ChaiScript& chai, henson::NameMap& namemap, std::string script_prefix)
{
    // BaseCoroutine
    chai.add(chaiscript::user_type<h::BaseCoroutine>(), "BaseCoroutine");
    chai.add(chaiscript::fun(&h::BaseCoroutine::running),      "running");
    chai.add(chaiscript::fun(&h::BaseCoroutine::signal_stop),  "signal_stop");
    chai.add(chaiscript::fun(&h::BaseCoroutine::total_time),   "total_time");
    chai.add(chaiscript::fun(&h::BaseCoroutine::name),         "name");

    // Puppet
    chai.add(chaiscript::base_class<h::BaseCoroutine, h::Puppet>());
    chai.add(chaiscript::user_type<h::Puppet>(),        "Puppet");
    chai.add(chaiscript::fun([](h::Puppet& puppet)
    {
        active_puppet = puppet.name();
        logger->debug("Proceeding with {}", puppet.name());
        puppet.proceed();
        return puppet.running();
    }), "proceed");

    chai.add(chaiscript::fun([&namemap,script_prefix](std::string cmd_line_str, henson::ProcMap* pm)
    {
        auto cmd_line = h::CommandLine(cmd_line_str);
        return std::make_shared<h::Puppet>(cmd_line.executable(script_prefix),
                                           cmd_line.argv.size(),
                                           &cmd_line.argv[0],
                                           pm,
                                           &namemap);
    }), "load");

#ifdef HENSON_PYTHON
    // PythonPuppet
    chai.add(chaiscript::base_class<h::BaseCoroutine, h::PythonPuppet>());
    chai.add(chaiscript::user_type<h::PythonPuppet>(),  "PythonPuppet");
    chai.add(chaiscript::fun([](h::PythonPuppet& puppet)
    {
        active_puppet = puppet.name();
        logger->debug("Proceeding with {}", puppet.name());
        puppet.proceed();
        return puppet.running();
    }), "proceed");
    chai.add(chaiscript::fun([&namemap,script_prefix](std::string python_cmd_line_str, henson::ProcMap* pm)
    {
        auto cmd_line = h::CommandLine(python_cmd_line_str);
        return std::make_shared<h::PythonPuppet>(cmd_line.executable(script_prefix), cmd_line.argv, pm, &namemap);
    }), "python");
#endif
}